

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_argv.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_300202::ArgParser::argJsonHelp(ArgParser *this,string *parameter)

{
  bool bVar1;
  uint uVar2;
  Pipeline *this_00;
  shared_ptr<Pipeline> sVar3;
  allocator<char> local_68 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  uVar2 = 2;
  if (parameter->_M_string_length != 0) {
    bVar1 = std::operator==(parameter,"latest");
    if (!bVar1) {
      uVar2 = QUtil::string_to_int((parameter->_M_dataplus)._M_p);
      if (uVar2 - 3 < 0xfffffffe) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_58,"unsupported json version ",local_68);
        std::operator+(&local_38,&local_58,parameter);
        QPDFArgParser::usage(&this->ap,&local_38);
        std::__cxx11::string::~string((string *)&local_38);
        std::__cxx11::string::~string((string *)&local_58);
      }
    }
  }
  QPDFLogger::defaultLogger();
  sVar3 = QPDFLogger::getInfo((QPDFLogger *)&local_58,(bool)local_68[0]);
  QPDFJob::json_out_schema_abi_cxx11_
            (&local_38,(QPDFJob *)(ulong)uVar2,
             (int)sVar3.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  this_00 = Pipeline::operator<<((Pipeline *)local_58._M_dataplus._M_p,&local_38);
  Pipeline::operator<<(this_00,"\n");
  std::__cxx11::string::~string((string *)&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58._M_string_length);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
  return;
}

Assistant:

void
ArgParser::argJsonHelp(std::string const& parameter)
{
    int version = JSON::LATEST;
    if (!(parameter.empty() || (parameter == "latest"))) {
        version = QUtil::string_to_int(parameter.c_str());
    }
    if ((version < 1) || (version > JSON::LATEST)) {
        usage(std::string("unsupported json version ") + parameter);
    }
    *QPDFLogger::defaultLogger()->getInfo() << QPDFJob::json_out_schema(version) << "\n";
}